

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  SimInfo *info;
  DumpWriter *this;
  Molecule *pMVar2;
  StuntDouble *this_00;
  int whichFrame;
  pointer ppSVar3;
  MoleculeIterator i;
  Thermo thermo;
  string outputFileName;
  string inputFileName;
  Vector3d COM;
  SimCreator creator;
  gengetopt_args_info args_info;
  Vector<double,_3U> local_12d0;
  Vector<double,_3U> local_12b8;
  Vector3d pos;
  DumpReader reader;
  
  OpenMD::registerLattice();
  inputFileName._M_dataplus._M_p = (pointer)&inputFileName.field_2;
  inputFileName._M_string_length = 0;
  inputFileName.field_2._M_local_buf[0] = '\0';
  outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
  outputFileName._M_string_length = 0;
  outputFileName.field_2._M_local_buf[0] = '\0';
  iVar1 = cmdline_parser(argc,argv,&args_info);
  if (iVar1 == 0) {
    if (args_info.inputs_num == 0) {
      builtin_strncpy(painCave.errMsg,"No input file name was specified on the command line",0x35);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      std::__cxx11::string::assign((char *)&inputFileName);
    }
    creator.mdFileName_._M_dataplus._M_p = (pointer)&creator.mdFileName_.field_2;
    creator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002bb148;
    creator.mdFileName_._M_string_length = 0;
    creator.mdFileName_.field_2._M_local_buf[0] = '\0';
    info = OpenMD::SimCreator::createSim(&creator,&inputFileName,false);
    OpenMD::DumpReader::DumpReader(&reader,info,&inputFileName);
    std::__cxx11::string::assign((char *)&outputFileName);
    iVar1 = std::__cxx11::string::compare((string *)&outputFileName);
    if (iVar1 == 0) {
      builtin_strncpy(painCave.errMsg,"Input and Output File names should be different!",0x31);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    this = (DumpWriter *)operator_new(0x60);
    OpenMD::DumpWriter::DumpWriter(this,info,&outputFileName);
    iVar1 = OpenMD::DumpReader::getNFrames(&reader);
    OpenMD::Vector<double,_3U>::Vector(&COM.super_Vector<double,_3U>);
    OpenMD::Vector<double,_3U>::Vector(&pos.super_Vector<double,_3U>);
    i._M_node = (_Base_ptr)0x0;
    whichFrame = 0;
    if (iVar1 < 1) {
      iVar1 = whichFrame;
    }
    thermo.info_ = info;
    for (; whichFrame != iVar1; whichFrame = whichFrame + 1) {
      OpenMD::DumpReader::readFrame(&reader,whichFrame);
      OpenMD::Thermo::getCom((Vector3d *)&local_12b8,&thermo);
      OpenMD::Vector<double,_3U>::operator=(&COM.super_Vector<double,_3U>,&local_12b8);
      pMVar2 = OpenMD::SimInfo::beginMolecule(info,&i);
      while (pMVar2 != (Molecule *)0x0) {
        ppSVar3 = (pMVar2->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppSVar3 !=
            (pMVar2->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00127296;
        this_00 = (StuntDouble *)0x0;
        while (this_00 != (StuntDouble *)0x0) {
          OpenMD::StuntDouble::getPos((Vector3d *)&local_12b8,this_00);
          OpenMD::Vector<double,_3U>::operator=(&pos.super_Vector<double,_3U>,&local_12b8);
          OpenMD::operator-(&local_12d0,&pos.super_Vector<double,_3U>,&COM.super_Vector<double,_3U>)
          ;
          OpenMD::Vector<double,_3U>::Vector(&local_12b8,&local_12d0);
          OpenMD::StuntDouble::setPos(this_00,(Vector3d *)&local_12b8);
          ppSVar3 = ppSVar3 + 1;
          this_00 = (StuntDouble *)0x0;
          if (ppSVar3 !=
              (pMVar2->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
LAB_00127296:
            this_00 = *ppSVar3;
          }
        }
        pMVar2 = OpenMD::SimInfo::nextMolecule(info,&i);
      }
      OpenMD::DumpWriter::writeDump(this);
    }
    OpenMD::DumpWriter::~DumpWriter(this);
    operator_delete(this,0x60);
    snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
             outputFileName._M_dataplus._M_p);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
    OpenMD::DumpReader::~DumpReader(&reader);
    OpenMD::SimCreator::~SimCreator(&creator);
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__cxx11::string::~string((string *)&inputFileName);
    return 0;
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  registerLattice();

  gengetopt_args_info args_info;

  std::string inputFileName;
  std::string outputFileName;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  // get input file name
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input file name was specified "
             "on the command line");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info = creator.createSim(inputFileName, false);
  DumpReader reader(info, inputFileName);

  outputFileName = args_info.output_arg;

  if (!outputFileName.compare(inputFileName)) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Input and Output File names should be different!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  DumpWriter* writer = new DumpWriter(info, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  int nFrames = reader.getNFrames();
  Vector3d COM;
  Vector3d pos;
  SimInfo::MoleculeIterator i;
  Molecule::IntegrableObjectIterator j;
  Molecule* mol;
  StuntDouble* sd;
  Thermo thermo(info);

  for (int istep = 0; istep < nFrames; istep++) {
    reader.readFrame(istep);
    COM = thermo.getCom();
    for (mol = info->beginMolecule(i); mol != NULL;
         mol = info->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        pos = sd->getPos();
        sd->setPos(pos - COM);
      }
    }
    writer->writeDump();
  }

  // deleting the writer will put the closing at the end of the dump file.

  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been generated.\n",
           outputFileName.c_str());
  painCave.severity = OPENMD_INFO;
  painCave.isFatal  = 0;
  simError();

  return 0;
}